

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanCode *table)

{
  VP8LBitReader *br;
  byte bVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  int code_length_code_lengths [19];
  uint local_29c;
  uint32_t local_288 [20];
  HuffmanCode local_238 [130];
  
  br = &dec->br_;
  uVar3 = VP8LReadBits(br,1);
  memset(code_lengths,0,(long)alphabet_size << 2);
  if (uVar3 == 0) {
    local_288[0x10] = 0;
    local_288[0x11] = 0;
    local_288[0x12] = 0;
    local_288[0xc] = 0;
    local_288[0xd] = 0;
    local_288[0xe] = 0;
    local_288[0xf] = 0;
    local_288[8] = 0;
    local_288[9] = 0;
    local_288[10] = 0;
    local_288[0xb] = 0;
    local_288[4] = 0;
    local_288[5] = 0;
    local_288[6] = 0;
    local_288[7] = 0;
    local_288[0] = 0;
    local_288[1] = 0;
    local_288[2] = 0;
    local_288[3] = 0;
    uVar3 = VP8LReadBits(br,4);
    uVar6 = uVar3 + 4;
    if (0x13 < (int)uVar6) goto LAB_0011205b;
    if (0 < (int)uVar6) {
      uVar13 = 0;
      do {
        uVar3 = VP8LReadBits(br,3);
        local_288["\x11\x12"[uVar13]] = uVar3;
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
    }
    iVar5 = VP8LBuildHuffmanTable(local_238,7,(int *)local_288,0x13);
    if (iVar5 == 0) goto LAB_0011205b;
    uVar3 = VP8LReadBits(br,1);
    iVar5 = alphabet_size;
    if (uVar3 != 0) {
      uVar3 = VP8LReadBits(br,3);
      uVar3 = VP8LReadBits(br,uVar3 * 2 + 2);
      iVar5 = uVar3 + 2;
      if (alphabet_size < iVar5) goto LAB_0011205b;
    }
    if (0 < alphabet_size) {
      local_29c = 8;
      iVar12 = 0;
      do {
        bVar14 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar14) break;
        iVar9 = (dec->br_).bit_pos_;
        if (0x1f < iVar9) {
          VP8LDoFillBitWindow(br);
          iVar9 = (dec->br_).bit_pos_;
        }
        uVar6 = (uint)((dec->br_).val_ >> ((byte)iVar9 & 0x3f)) & 0x7f;
        (dec->br_).bit_pos_ = (uint)local_238[uVar6].bits + iVar9;
        uVar2 = local_238[uVar6].value;
        if (uVar2 < 0x10) {
          lVar8 = (long)iVar12;
          iVar12 = iVar12 + 1;
          uVar6 = (uint)uVar2;
          code_lengths[lVar8] = uVar6;
          if (uVar6 != 0) {
            local_29c = uVar6;
          }
        }
        else {
          bVar1 = "\x03\x03\v"[uVar2 - 0x10];
          uVar3 = VP8LReadBits(br,(uint)"\x02\x03\a"[uVar2 - 0x10]);
          iVar10 = uVar3 + bVar1;
          iVar9 = iVar10 + iVar12;
          if (alphabet_size < iVar9) goto LAB_0011205b;
          uVar6 = 0;
          if (uVar2 == 0x10) {
            uVar6 = local_29c;
          }
          if (0 < iVar10) {
            puVar11 = (uint *)(code_lengths + iVar12);
            uVar7 = uVar3 + bVar1 + 1;
            do {
              *puVar11 = uVar6;
              puVar11 = puVar11 + 1;
              uVar7 = uVar7 - 1;
              iVar12 = iVar9;
            } while (1 < uVar7);
          }
        }
      } while (iVar12 < alphabet_size);
    }
  }
  else {
    uVar3 = VP8LReadBits(br,1);
    uVar4 = VP8LReadBits(br,1);
    iVar5 = 8;
    if (uVar4 == 0) {
      iVar5 = 1;
    }
    uVar4 = VP8LReadBits(br,iVar5);
    code_lengths[(int)uVar4] = 1;
    if (uVar3 == 1) {
      uVar3 = VP8LReadBits(br,8);
      code_lengths[(int)uVar3] = 1;
    }
  }
  if (((dec->br_).eos_ == 0) &&
     (iVar5 = VP8LBuildHuffmanTable(table,8,code_lengths,alphabet_size), iVar5 != 0)) {
    return iVar5;
  }
LAB_0011205b:
  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
  return 0;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths, HuffmanCode* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br_;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bit long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    if (num_codes > NUM_CODE_LENGTH_CODES) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      return 0;
    }

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos_;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    return 0;
  }
  return size;
}